

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
duckdb_re2::DFA::Search
          (DFA *this,StringPiece *text,StringPiece *context,bool anchored,bool want_earliest_match,
          bool run_forward,bool *failed,char **epp,SparseSet *matches)

{
  bool bVar1;
  size_type sVar2;
  SearchParams params;
  RWLocker local_98;
  SearchParams local_88;
  
  *epp = (char *)0x0;
  if (this->init_failed_ == true) {
    *failed = true;
    return false;
  }
  *failed = false;
  local_98.mu_ = &this->cache_mutex_;
  local_98.writing_ = false;
  Mutex::ReaderLock(local_98.mu_);
  local_88.text.data_ = text->data_;
  local_88.text.size_ = text->size_;
  local_88.context.data_ = context->data_;
  local_88.context.size_ = context->size_;
  local_88.start = (State *)0x0;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.can_prefix_accel = false;
  local_88.anchored = anchored;
  local_88.want_earliest_match = want_earliest_match;
  local_88.run_forward = run_forward;
  local_88.matches = matches;
  local_88.cache_lock = &local_98;
  bVar1 = AnalyzeSearch(this,&local_88);
  if (bVar1) {
    if (local_88.start != (State *)0x1) {
      if (local_88.start == (State *)0x2) {
        if (want_earliest_match == run_forward) {
          sVar2 = 0;
        }
        else {
          sVar2 = text->size_;
        }
        *epp = text->data_ + sVar2;
        bVar1 = true;
        goto LAB_00410d21;
      }
      bVar1 = FastSearchLoop(this,&local_88);
      if (local_88.failed != true) {
        *epp = local_88.ep;
        goto LAB_00410d21;
      }
      *failed = true;
    }
  }
  else {
    *failed = true;
  }
  bVar1 = false;
LAB_00410d21:
  RWLocker::~RWLocker(&local_98);
  return bVar1;
}

Assistant:

bool DFA::Search(const StringPiece& text,
                 const StringPiece& context,
                 bool anchored,
                 bool want_earliest_match,
                 bool run_forward,
                 bool* failed,
                 const char** epp,
                 SparseSet* matches) {
  *epp = NULL;
  if (!ok()) {
    *failed = true;
    return false;
  }
  *failed = false;

  RWLocker l(&cache_mutex_);
  SearchParams params(text, context, &l);
  params.anchored = anchored;
  params.want_earliest_match = want_earliest_match;
  params.run_forward = run_forward;
  params.matches = matches;

  if (!AnalyzeSearch(&params)) {
    *failed = true;
    return false;
  }
  if (params.start == DeadState)
    return false;
  if (params.start == FullMatchState) {
    if (run_forward == want_earliest_match)
      *epp = text.data();
    else
      *epp = text.data() + text.size();
    return true;
  }
  bool ret = FastSearchLoop(&params);
  if (params.failed) {
    *failed = true;
    return false;
  }
  *epp = params.ep;
  return ret;
}